

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::InstanceArrayIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined8 uVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  undefined1 (*pauVar7) [16];
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  Primitive *prim;
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  uint uVar18;
  float fVar27;
  float fVar29;
  vint4 bi;
  undefined1 auVar19 [16];
  uint uVar28;
  uint uVar30;
  float fVar31;
  uint uVar32;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  vint4 bi_1;
  float fVar36;
  float fVar37;
  uint uVar38;
  float fVar39;
  uint uVar40;
  float fVar41;
  uint uVar42;
  vint4 ai;
  float fVar43;
  uint uVar44;
  vint4 ai_1;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1029;
  uint local_1028 [6];
  ulong local_1010;
  ulong local_1008;
  RayHit *local_1000;
  RayQueryContext *local_ff8;
  long local_ff0;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_ff8 = context;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar13 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar67 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar71 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar53 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar34 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar57 = 0.0;
    if (0.0 <= fVar34) {
      fVar57 = fVar34;
    }
    fVar34 = (ray->super_RayK<1>).tfar;
    fVar33 = 0.0;
    if (0.0 <= fVar34) {
      fVar33 = fVar34;
    }
    auVar19._4_4_ = -(uint)(ABS(aVar2.y) < DAT_01f4bd50._4_4_);
    auVar19._0_4_ = -(uint)(ABS(aVar2.x) < (float)DAT_01f4bd50);
    auVar19._8_4_ = -(uint)(ABS(aVar2.z) < DAT_01f4bd50._8_4_);
    auVar19._12_4_ = -(uint)(ABS(aVar2.field_3.w) < DAT_01f4bd50._12_4_);
    auVar45 = blendvps((undefined1  [16])aVar2,_DAT_01f4bd50,auVar19);
    auVar19 = rcpps(auVar19,auVar45);
    fVar61 = auVar19._0_4_;
    fVar62 = auVar19._4_4_;
    fVar64 = auVar19._8_4_;
    fVar61 = (1.0 - auVar45._0_4_ * fVar61) * fVar61 + fVar61;
    fVar62 = (1.0 - auVar45._4_4_ * fVar62) * fVar62 + fVar62;
    fVar64 = (1.0 - auVar45._8_4_ * fVar64) * fVar64 + fVar64;
    uVar9 = (ulong)(fVar61 < 0.0) << 4;
    uVar10 = (ulong)(fVar62 < 0.0) << 4 | 0x20;
    uVar14 = (ulong)(fVar64 < 0.0) << 4 | 0x40;
    uVar8 = uVar9 ^ 0x10;
    uVar15 = uVar10 ^ 0x10;
    local_1000 = ray;
    local_f88 = fVar53;
    fStack_f84 = fVar53;
    fStack_f80 = fVar53;
    fStack_f7c = fVar53;
    local_f98 = fVar57;
    fStack_f94 = fVar57;
    fStack_f90 = fVar57;
    fStack_f8c = fVar57;
    local_fa8 = fVar64;
    fStack_fa4 = fVar64;
    fStack_fa0 = fVar64;
    fStack_f9c = fVar64;
    local_fb8 = fVar67;
    fStack_fb4 = fVar67;
    fStack_fb0 = fVar67;
    fStack_fac = fVar67;
    local_fc8 = fVar71;
    fStack_fc4 = fVar71;
    fStack_fc0 = fVar71;
    fStack_fbc = fVar71;
    local_1008 = uVar9;
    local_fd8 = fVar61;
    fStack_fd4 = fVar61;
    fStack_fd0 = fVar61;
    fStack_fcc = fVar61;
    local_fe8 = fVar62;
    fStack_fe4 = fVar62;
    fStack_fe0 = fVar62;
    fStack_fdc = fVar62;
    local_1010 = uVar10;
    fVar34 = fVar33;
    fVar35 = fVar33;
    fVar36 = fVar33;
    fVar54 = fVar53;
    fVar55 = fVar53;
    fVar56 = fVar53;
    fVar58 = fVar57;
    fVar59 = fVar57;
    fVar60 = fVar57;
    fVar63 = fVar64;
    fVar65 = fVar64;
    fVar66 = fVar64;
    fVar68 = fVar67;
    fVar69 = fVar67;
    fVar70 = fVar67;
    fVar72 = fVar71;
    fVar73 = fVar71;
    fVar74 = fVar71;
    fVar75 = fVar61;
    fVar76 = fVar61;
    fVar77 = fVar61;
    fVar78 = fVar62;
    fVar79 = fVar62;
    fVar80 = fVar62;
LAB_006a9aa3:
    if (pauVar13 != (undefined1 (*) [16])&local_f78) {
      pauVar7 = pauVar13 + -1;
      pauVar13 = pauVar13 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar7 + 8) < *pfVar1 || *(float *)((long)*pauVar7 + 8) == *pfVar1) {
        pauVar7 = (undefined1 (*) [16])&local_f78;
        pauVar11 = *(undefined1 (**) [16])*pauVar13;
        while (((ulong)pauVar11 & 8) == 0) {
          pfVar1 = (float *)((long)pauVar11[2] + uVar9);
          fVar17 = (*pfVar1 - fVar67) * fVar61;
          fVar27 = (pfVar1[1] - fVar68) * fVar75;
          fVar29 = (pfVar1[2] - fVar69) * fVar76;
          fVar31 = (pfVar1[3] - fVar70) * fVar77;
          pfVar1 = (float *)((long)pauVar11[2] + uVar10);
          fVar37 = (*pfVar1 - fVar71) * fVar62;
          fVar39 = (pfVar1[1] - fVar72) * fVar78;
          fVar41 = (pfVar1[2] - fVar73) * fVar79;
          fVar43 = (pfVar1[3] - fVar74) * fVar80;
          uVar38 = (uint)((int)fVar37 < (int)fVar17) * (int)fVar17 |
                   (uint)((int)fVar37 >= (int)fVar17) * (int)fVar37;
          uVar40 = (uint)((int)fVar39 < (int)fVar27) * (int)fVar27 |
                   (uint)((int)fVar39 >= (int)fVar27) * (int)fVar39;
          uVar42 = (uint)((int)fVar41 < (int)fVar29) * (int)fVar29 |
                   (uint)((int)fVar41 >= (int)fVar29) * (int)fVar41;
          uVar44 = (uint)((int)fVar43 < (int)fVar31) * (int)fVar31 |
                   (uint)((int)fVar43 >= (int)fVar31) * (int)fVar43;
          pfVar1 = (float *)((long)pauVar11[2] + uVar14);
          fVar17 = (*pfVar1 - fVar53) * fVar64;
          fVar27 = (pfVar1[1] - fVar54) * fVar63;
          fVar29 = (pfVar1[2] - fVar55) * fVar65;
          fVar31 = (pfVar1[3] - fVar56) * fVar66;
          uVar18 = (uint)((int)fVar17 < (int)fVar57) * (int)fVar57 |
                   (uint)((int)fVar17 >= (int)fVar57) * (int)fVar17;
          uVar28 = (uint)((int)fVar27 < (int)fVar58) * (int)fVar58 |
                   (uint)((int)fVar27 >= (int)fVar58) * (int)fVar27;
          uVar30 = (uint)((int)fVar29 < (int)fVar59) * (int)fVar59 |
                   (uint)((int)fVar29 >= (int)fVar59) * (int)fVar29;
          uVar32 = (uint)((int)fVar31 < (int)fVar60) * (int)fVar60 |
                   (uint)((int)fVar31 >= (int)fVar60) * (int)fVar31;
          local_1028[0] =
               ((int)uVar18 < (int)uVar38) * uVar38 | ((int)uVar18 >= (int)uVar38) * uVar18;
          local_1028[1] =
               ((int)uVar28 < (int)uVar40) * uVar40 | ((int)uVar28 >= (int)uVar40) * uVar28;
          local_1028[2] =
               ((int)uVar30 < (int)uVar42) * uVar42 | ((int)uVar30 >= (int)uVar42) * uVar30;
          local_1028[3] =
               ((int)uVar32 < (int)uVar44) * uVar44 | ((int)uVar32 >= (int)uVar44) * uVar32;
          pfVar1 = (float *)((long)pauVar11[2] + uVar8);
          fVar17 = (*pfVar1 - fVar67) * fVar61;
          fVar27 = (pfVar1[1] - fVar68) * fVar75;
          fVar29 = (pfVar1[2] - fVar69) * fVar76;
          fVar31 = (pfVar1[3] - fVar70) * fVar77;
          pfVar1 = (float *)((long)pauVar11[2] + uVar15);
          fVar37 = (*pfVar1 - fVar71) * fVar62;
          fVar39 = (pfVar1[1] - fVar72) * fVar78;
          fVar41 = (pfVar1[2] - fVar73) * fVar79;
          fVar43 = (pfVar1[3] - fVar74) * fVar80;
          uVar38 = (uint)((int)fVar17 < (int)fVar37) * (int)fVar17 |
                   (uint)((int)fVar17 >= (int)fVar37) * (int)fVar37;
          uVar40 = (uint)((int)fVar27 < (int)fVar39) * (int)fVar27 |
                   (uint)((int)fVar27 >= (int)fVar39) * (int)fVar39;
          uVar42 = (uint)((int)fVar29 < (int)fVar41) * (int)fVar29 |
                   (uint)((int)fVar29 >= (int)fVar41) * (int)fVar41;
          uVar44 = (uint)((int)fVar31 < (int)fVar43) * (int)fVar31 |
                   (uint)((int)fVar31 >= (int)fVar43) * (int)fVar43;
          pfVar1 = (float *)((long)pauVar11[2] + (uVar14 ^ 0x10));
          fVar17 = (*pfVar1 - fVar53) * fVar64;
          fVar27 = (pfVar1[1] - fVar54) * fVar63;
          fVar29 = (pfVar1[2] - fVar55) * fVar65;
          fVar31 = (pfVar1[3] - fVar56) * fVar66;
          uVar18 = (uint)((int)fVar33 < (int)fVar17) * (int)fVar33 |
                   (uint)((int)fVar33 >= (int)fVar17) * (int)fVar17;
          uVar28 = (uint)((int)fVar34 < (int)fVar27) * (int)fVar34 |
                   (uint)((int)fVar34 >= (int)fVar27) * (int)fVar27;
          uVar30 = (uint)((int)fVar35 < (int)fVar29) * (int)fVar35 |
                   (uint)((int)fVar35 >= (int)fVar29) * (int)fVar29;
          uVar32 = (uint)((int)fVar36 < (int)fVar31) * (int)fVar36 |
                   (uint)((int)fVar36 >= (int)fVar31) * (int)fVar31;
          auVar45._0_4_ =
               -(uint)((int)(((int)uVar38 < (int)uVar18) * uVar38 |
                            ((int)uVar38 >= (int)uVar18) * uVar18) < (int)local_1028[0]);
          auVar45._4_4_ =
               -(uint)((int)(((int)uVar40 < (int)uVar28) * uVar40 |
                            ((int)uVar40 >= (int)uVar28) * uVar28) < (int)local_1028[1]);
          auVar45._8_4_ =
               -(uint)((int)(((int)uVar42 < (int)uVar30) * uVar42 |
                            ((int)uVar42 >= (int)uVar30) * uVar30) < (int)local_1028[2]);
          auVar45._12_4_ =
               -(uint)((int)(((int)uVar44 < (int)uVar32) * uVar44 |
                            ((int)uVar44 >= (int)uVar32) * uVar32) < (int)local_1028[3]);
          iVar6 = movmskps((int)pauVar7,auVar45);
          if (iVar6 == 0xf) goto LAB_006a9aa3;
          bVar5 = (byte)iVar6 ^ 0xf;
          uVar12 = (ulong)pauVar11 & 0xfffffffffffffff0;
          lVar4 = 0;
          if (bVar5 != 0) {
            for (; (bVar5 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          pauVar7 = *(undefined1 (**) [16])(uVar12 + lVar4 * 8);
          uVar18 = bVar5 - 1 & (uint)bVar5;
          pauVar11 = pauVar7;
          if (uVar18 != 0) {
            uVar28 = local_1028[lVar4];
            lVar4 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
              }
            }
            pauVar11 = *(undefined1 (**) [16])(uVar12 + lVar4 * 8);
            uVar30 = local_1028[lVar4];
            uVar18 = uVar18 - 1 & uVar18;
            if (uVar18 == 0) {
              if (uVar28 < uVar30) {
                *(undefined1 (**) [16])*pauVar13 = pauVar11;
                *(uint *)((long)*pauVar13 + 8) = uVar30;
                pauVar11 = pauVar7;
                pauVar13 = pauVar13 + 1;
              }
              else {
                *(undefined1 (**) [16])*pauVar13 = pauVar7;
                *(uint *)((long)*pauVar13 + 8) = uVar28;
                pauVar7 = pauVar11;
                pauVar13 = pauVar13 + 1;
              }
            }
            else {
              auVar47._8_4_ = uVar28;
              auVar47._0_8_ = pauVar7;
              auVar47._12_4_ = 0;
              auVar49._8_4_ = uVar30;
              auVar49._0_8_ = pauVar11;
              auVar49._12_4_ = 0;
              lVar4 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              uVar3 = *(undefined8 *)(uVar12 + lVar4 * 8);
              uVar32 = local_1028[lVar4];
              auVar52._8_4_ = uVar32;
              auVar52._0_8_ = uVar3;
              auVar52._12_4_ = 0;
              auVar50._8_4_ = -(uint)((int)uVar28 < (int)uVar30);
              uVar18 = uVar18 - 1 & uVar18;
              if (uVar18 == 0) {
                auVar50._4_4_ = auVar50._8_4_;
                auVar50._0_4_ = auVar50._8_4_;
                auVar50._12_4_ = auVar50._8_4_;
                auVar48._8_4_ = uVar30;
                auVar48._0_8_ = pauVar11;
                auVar48._12_4_ = 0;
                auVar45 = blendvps(auVar48,auVar47,auVar50);
                auVar19 = blendvps(auVar47,auVar49,auVar50);
                auVar20._8_4_ = -(uint)(auVar45._8_4_ < (int)uVar32);
                auVar20._4_4_ = auVar20._8_4_;
                auVar20._0_4_ = auVar20._8_4_;
                auVar20._12_4_ = auVar20._8_4_;
                auVar46._8_4_ = uVar32;
                auVar46._0_8_ = uVar3;
                auVar46._12_4_ = 0;
                auVar47 = blendvps(auVar46,auVar45,auVar20);
                auVar49 = blendvps(auVar45,auVar52,auVar20);
                auVar21._8_4_ = -(uint)(auVar19._8_4_ < auVar49._8_4_);
                auVar21._4_4_ = auVar21._8_4_;
                auVar21._0_4_ = auVar21._8_4_;
                auVar21._12_4_ = auVar21._8_4_;
                auVar45 = blendvps(auVar49,auVar19,auVar21);
                auVar19 = blendvps(auVar19,auVar49,auVar21);
                *pauVar13 = auVar19;
                pauVar13[1] = auVar45;
                pauVar7 = auVar47._0_8_;
                pauVar13 = pauVar13 + 2;
                pauVar11 = pauVar7;
              }
              else {
                lVar4 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                  }
                }
                auVar22._4_4_ = auVar50._8_4_;
                auVar22._0_4_ = auVar50._8_4_;
                auVar22._8_4_ = auVar50._8_4_;
                auVar22._12_4_ = auVar50._8_4_;
                auVar50 = blendvps(auVar49,auVar47,auVar22);
                auVar19 = blendvps(auVar47,auVar49,auVar22);
                auVar51._8_4_ = local_1028[lVar4];
                auVar51._0_8_ = *(undefined8 *)(uVar12 + lVar4 * 8);
                auVar51._12_4_ = 0;
                auVar23._8_4_ = -(uint)((int)uVar32 < (int)local_1028[lVar4]);
                auVar23._4_4_ = auVar23._8_4_;
                auVar23._0_4_ = auVar23._8_4_;
                auVar23._12_4_ = auVar23._8_4_;
                auVar47 = blendvps(auVar51,auVar52,auVar23);
                auVar45 = blendvps(auVar52,auVar51,auVar23);
                auVar24._8_4_ = -(uint)(auVar19._8_4_ < auVar45._8_4_);
                auVar24._4_4_ = auVar24._8_4_;
                auVar24._0_4_ = auVar24._8_4_;
                auVar24._12_4_ = auVar24._8_4_;
                auVar52 = blendvps(auVar45,auVar19,auVar24);
                auVar19 = blendvps(auVar19,auVar45,auVar24);
                auVar25._8_4_ = -(uint)(auVar50._8_4_ < auVar47._8_4_);
                auVar25._4_4_ = auVar25._8_4_;
                auVar25._0_4_ = auVar25._8_4_;
                auVar25._12_4_ = auVar25._8_4_;
                auVar45 = blendvps(auVar47,auVar50,auVar25);
                auVar49 = blendvps(auVar50,auVar47,auVar25);
                auVar26._8_4_ = -(uint)(auVar49._8_4_ < auVar52._8_4_);
                auVar26._4_4_ = auVar26._8_4_;
                auVar26._0_4_ = auVar26._8_4_;
                auVar26._12_4_ = auVar26._8_4_;
                auVar47 = blendvps(auVar52,auVar49,auVar26);
                auVar49 = blendvps(auVar49,auVar52,auVar26);
                *pauVar13 = auVar19;
                pauVar13[1] = auVar49;
                pauVar13[2] = auVar47;
                pauVar7 = auVar45._0_8_;
                pauVar13 = pauVar13 + 3;
                pauVar11 = pauVar7;
              }
            }
          }
        }
        local_ff0 = (ulong)((uint)pauVar11 & 0xf) - 8;
        prim = (Primitive *)((ulong)pauVar11 & 0xfffffffffffffff0);
        while (bVar16 = local_ff0 != 0, local_ff0 = local_ff0 + -1, bVar16) {
          InstanceArrayIntersector1::intersect(&local_1029,ray,local_ff8,prim);
          prim = prim + 1;
          ray = local_1000;
          uVar9 = local_1008;
          uVar10 = local_1010;
          fVar53 = local_f88;
          fVar54 = fStack_f84;
          fVar55 = fStack_f80;
          fVar56 = fStack_f7c;
          fVar57 = local_f98;
          fVar58 = fStack_f94;
          fVar59 = fStack_f90;
          fVar60 = fStack_f8c;
          fVar64 = local_fa8;
          fVar63 = fStack_fa4;
          fVar65 = fStack_fa0;
          fVar66 = fStack_f9c;
          fVar67 = local_fb8;
          fVar68 = fStack_fb4;
          fVar69 = fStack_fb0;
          fVar70 = fStack_fac;
          fVar71 = local_fc8;
          fVar72 = fStack_fc4;
          fVar73 = fStack_fc0;
          fVar74 = fStack_fbc;
          fVar61 = local_fd8;
          fVar75 = fStack_fd4;
          fVar76 = fStack_fd0;
          fVar77 = fStack_fcc;
          fVar62 = local_fe8;
          fVar78 = fStack_fe4;
          fVar79 = fStack_fe0;
          fVar80 = fStack_fdc;
        }
        fVar33 = (ray->super_RayK<1>).tfar;
        fVar34 = fVar33;
        fVar35 = fVar33;
        fVar36 = fVar33;
      }
      goto LAB_006a9aa3;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }